

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gdsForge.cpp
# Opt level: O2

void __thiscall gdsForge::gdsSRef(gdsForge *this,gdsSREF *in_SREF,bool minimal)

{
  double dVar1;
  undefined7 in_register_00000011;
  int data [1];
  double arrDou [1];
  undefined8 local_70;
  bitset<16UL> bits;
  string local_60;
  string local_40;
  
  GDSwriteRec(this,0xa00);
  if ((int)CONCAT71(in_register_00000011,minimal) == 0) {
    data[0] = in_SREF->plex;
    GDSwriteInt(this,0x2f03,data,1);
  }
  std::__cxx11::string::string((string *)&local_40,(string *)&in_SREF->name);
  GDSwriteStr(this,0x1206,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  bits.super__Base_bitset<1UL>._M_w = (_Base_bitset<1UL>)0;
  std::bitset<16UL>::set(&bits,0xf,in_SREF->reflection);
  std::bitset<16UL>::set(&bits,2,(bool)(-(in_SREF->scale != 1.0) & 1));
  std::bitset<16UL>::set(&bits,1,(bool)(-(in_SREF->angle != 0.0) & 1));
  GDSwriteBitArr(this,0x1a01,bits);
  dVar1 = in_SREF->scale;
  if ((dVar1 != 1.0) || (NAN(dVar1))) {
    arrDou[0] = dVar1;
    GDSwriteRea(this,0x1b05,arrDou,1);
  }
  dVar1 = in_SREF->angle;
  if ((dVar1 != 0.0) || (NAN(dVar1))) {
    arrDou[0] = dVar1;
    GDSwriteRea(this,0x1c05,arrDou,1);
  }
  local_70._0_4_ = in_SREF->xCor;
  local_70._4_4_ = in_SREF->yCor;
  GDSwriteInt(this,0x1003,(int *)&local_70,2);
  if (!minimal) {
    data[0] = in_SREF->propattr;
    GDSwriteInt(this,0x2b02,data,1);
    std::__cxx11::string::string((string *)&local_60,(string *)&in_SREF->propvalue);
    GDSwriteStr(this,0x2c06,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
  }
  GDSwriteRec(this,0x1100);
  return;
}

Assistant:

void gdsForge::gdsSRef(const gdsSREF &in_SREF, bool minimal)
{
  int data[1];
  this->GDSwriteRec(GDS_SREF);

  // ELFLAGS and PLEX are optional
  if (minimal == false) {
    data[0] = in_SREF.plex;
    this->GDSwriteInt(GDS_PLEX, data, 1);
  }

  // name of the structure that is referenced
  this->GDSwriteStr(GDS_SNAME, in_SREF.name);

  // two byte, bit array controlling reflection, magnification and rotation.
  bitset<16> bits;

  // reflect across x-axis
  bits.set(15, in_SREF.reflection);

  // magnification, default 1
  if (in_SREF.scale == 1)
    bits.set(2, 0);
  else
    bits.set(2, 1);

  // angle of rotation
  if (in_SREF.angle == 0)
    bits.set(1, 0);
  else
    bits.set(1, 1);

  this->GDSwriteBitArr(GDS_STRANS, bits);

  double arrDou[1];
  // Magnification, default 1
  if (in_SREF.scale != 1) {
    arrDou[0] = in_SREF.scale;
    this->GDSwriteRea(GDS_MAG, arrDou, 1);
  }

  // Angle measured counterclockwise
  if (in_SREF.angle != 0) {
    arrDou[0] = in_SREF.angle;
    this->GDSwriteRea(GDS_ANGLE, arrDou, 1);
  }

  int corXY[2];
  corXY[0] = in_SREF.xCor;
  corXY[1] = in_SREF.yCor;
  this->GDSwriteInt(GDS_XY, corXY, 2);

  // Optional goodies
  if (minimal == false) {
    data[0] = in_SREF.propattr;
    this->GDSwriteInt(GDS_PROPATTR, data, 1);

    this->GDSwriteStr(GDS_PROPVALUE, in_SREF.propvalue);
  }

  this->GDSwriteRec(GDS_ENDEL);
}